

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen1_2x3.cpp
# Opt level: O2

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3D>
                 (DB *db,LIST *params,IfcCartesianTransformationOperator3D *in)

{
  undefined1 *puVar1;
  pointer psVar2;
  long lVar3;
  TypeError *this;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  string local_60;
  allocator<char> local_40 [32];
  
  GenericFill<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator>
            (db,params,&in->super_IfcCartesianTransformationOperator);
  psVar2 = (params->members).
           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0x40 < (ulong)((long)(params->members).
                           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2)) {
    std::__shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&arg.
                  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                 ,&psVar2[4].
                   super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                );
    lVar3 = __dynamic_cast(arg.
                           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0);
    if (lVar3 == 0) {
      lVar3 = __dynamic_cast(arg.
                             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
      if (lVar3 == 0) {
        GenericConvert<Assimp::STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>>>
                  ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *)
                   &(in->super_IfcCartesianTransformationOperator).field_0x78,&arg,db);
      }
    }
    else {
      puVar1 = &(in->super_IfcCartesianTransformationOperator).field_0x70;
      *puVar1 = *puVar1 | 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&arg.
                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return 5;
  }
  this = (TypeError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"expected 5 arguments to IfcCartesianTransformationOperator3D",
             local_40);
  TypeError::TypeError(this,&local_60,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t GenericFill<IfcCartesianTransformationOperator3D>(const DB& db, const LIST& params, IfcCartesianTransformationOperator3D* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcCartesianTransformationOperator*>(in));
	if (params.GetSize() < 5) { throw STEP::TypeError("expected 5 arguments to IfcCartesianTransformationOperator3D"); }    do { // convert the 'Axis3' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3D,1>::aux_is_derived[0]=true; break; }
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->Axis3, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 4 to IfcCartesianTransformationOperator3D to be a `IfcDirection`")); }
    } while(0);
	return base;
}